

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

bool __thiscall RenX::Server::removeCommand(Server *this,GameCommand *command)

{
  bool bVar1;
  pointer this_00;
  pointer pGVar2;
  const_iterator local_38;
  __normal_iterator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
  local_30;
  __normal_iterator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
  local_28;
  iterator itr;
  GameCommand *command_local;
  Server *this_local;
  
  itr._M_current = (unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_> *)command
  ;
  local_28._M_current =
       (unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_> *)
       std::
       vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
       ::begin(&this->m_commands);
  while( true ) {
    local_30._M_current =
         (unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_> *)
         std::
         vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
         ::end(&this->m_commands);
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
                      (&local_28,&local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
              ::operator->(&local_28);
    pGVar2 = std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>::get
                       (this_00);
    if (pGVar2 == (pointer)itr._M_current) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
    ::operator++(&local_28);
  }
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>const*,std::vector<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>,std::allocator<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>>>>
  ::__normal_iterator<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>*>
            ((__normal_iterator<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>const*,std::vector<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>,std::allocator<std::unique_ptr<RenX::GameCommand,std::default_delete<RenX::GameCommand>>>>>
              *)&local_38,&local_28);
  std::
  vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
  ::erase(&this->m_commands,local_38);
  return true;
}

Assistant:

bool RenX::Server::removeCommand(RenX::GameCommand *command) {
	for (auto itr = m_commands.begin(); itr != m_commands.end(); ++itr) {
		if (itr->get() == command) {
			m_commands.erase(itr);
			return true;
		}
	}

	return false;
}